

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

bool __thiscall
mpt::typed_array<mpt::message_store::entry>::insert
          (typed_array<mpt::message_store::entry> *this,long pos,entry *val)

{
  bool bVar1;
  content<mpt::message_store::entry> *this_00;
  entry *this_01;
  void *d;
  long len;
  entry *val_local;
  long pos_local;
  typed_array<mpt::message_store::entry> *this_local;
  
  d = (void *)unique_array<mpt::message_store::entry>::length
                        (&this->super_unique_array<mpt::message_store::entry>);
  if (pos < 0) {
    val_local = (entry *)((long)d + pos);
    if ((long)val_local < 0) {
      return false;
    }
  }
  else {
    val_local = (entry *)pos;
    if ((long)d < pos) {
      d = (void *)pos;
    }
  }
  bVar1 = unique_array<mpt::message_store::entry>::reserve
                    (&this->super_unique_array<mpt::message_store::entry>,(long)d + 1);
  if (bVar1) {
    this_00 = reference<mpt::content<mpt::message_store::entry>_>::instance
                        ((reference<mpt::content<mpt::message_store::entry>_> *)this);
    this_01 = (entry *)content<mpt::message_store::entry>::insert(this_00,(long)val_local);
    if (this_01 == (entry *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      message_store::entry::entry(this_01,val);
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool insert(long pos, const T &val)
	{
		long len = this->length();
		if (pos < 0) {
			if ((pos += len) < 0) {
				return 0;
			}
		}
		else if (pos > len) {
			len = pos;
		}
		if (!this->reserve(len + 1)) {
			return 0;
		}
		void *d = this->_ref.instance()->insert(pos);
		if (d) {
			new (d) T(val);
			return true;
		}
		return false;
	}